

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_hashtable.cc
# Opt level: O0

RC __thiscall PF_HashTable::Delete(PF_HashTable *this,int fd,PageNum pageNum)

{
  int iVar1;
  PF_HashEntry *local_30;
  PF_HashEntry *entry;
  int bucket;
  PageNum pageNum_local;
  int fd_local;
  PF_HashTable *this_local;
  
  iVar1 = Hash(this,fd,pageNum);
  for (local_30 = this->hashTable[iVar1];
      (local_30 != (PF_HashEntry *)0x0 && ((local_30->fd != fd || (local_30->pageNum != pageNum))));
      local_30 = local_30->next) {
  }
  if (local_30 == (PF_HashEntry *)0x0) {
    this_local._4_4_ = -8;
  }
  else {
    if (local_30 == this->hashTable[iVar1]) {
      this->hashTable[iVar1] = local_30->next;
    }
    if (local_30->prev != (PF_HashEntry *)0x0) {
      local_30->prev->next = local_30->next;
    }
    if (local_30->next != (PF_HashEntry *)0x0) {
      local_30->next->prev = local_30->prev;
    }
    if (local_30 != (PF_HashEntry *)0x0) {
      operator_delete(local_30);
    }
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

RC PF_HashTable::Delete(int fd, PageNum pageNum)
{
  // Get which bucket it should be in
  int bucket = Hash(fd, pageNum);

  // Find the entry is in this bucket
  PF_HashEntry *entry;
  for (entry = hashTable[bucket];
       entry != NULL;
       entry = entry->next) {
    if (entry->fd == fd && entry->pageNum == pageNum)
      break;
  }

  // Did we find hash entry?
  if (entry == NULL)
    return (PF_HASHNOTFOUND);

  // Remove this entry
  if (entry == hashTable[bucket])
    hashTable[bucket] = entry->next;
  if (entry->prev != NULL)
    entry->prev->next = entry->next;
  if (entry->next != NULL)
    entry->next->prev = entry->prev;
  delete entry;

  // Return ook
  return (0);
}